

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleThreadPool.cpp
# Opt level: O0

void __thiscall Source::operator()(Source *this)

{
  double *in_RSI;
  double local_30;
  result_type_conflict1 local_24;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  int local_18;
  int local_14;
  int i;
  int val;
  Source *this_local;
  
  local_14 = 0;
  _i = this;
  for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
    local_24 = std::uniform_int_distribution<int>::operator()(&distrib,&gen);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_20,&local_24);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
    local_30 = (double)local_14;
    in_RSI = &local_30;
    local_14 = local_14 + 1;
    rtb::Concurrency::Queue<double>::push(this->outputQueue_,in_RSI);
  }
  rtb::Concurrency::Queue<double>::close(this->outputQueue_,(int)in_RSI);
  return;
}

Assistant:

void operator()() {
        int val = 0;
        for(int i{0}; i < 7; ++i) {
            std::this_thread::sleep_for(std::chrono::milliseconds(distrib(gen)));
            outputQueue_.push(val++);
        }
        outputQueue_.close();
    }